

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O1

ssize_t __thiscall BitInStream::read(BitInStream *this,int __fd,void *__buf,size_t __nbytes)

{
  CRC *this_00;
  pointer puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uStack_18;
  
  if ((this->cByte != -1) && (this->streamDone != true)) {
    if (this->remBits == 0) {
      uVar4 = this->sync;
      if (((uVar4 == 0) || (this->bCount % (int)uVar4 != 0)) || (this->flag != false)) {
        uStack_18 = in_RAX;
        iVar3 = std::istream::get();
        if (iVar3 == -1) {
          iVar3 = endStream(this);
          return CONCAT44(extraout_var_00,iVar3);
        }
        uStack_18 = CONCAT17((char)iVar3,(undefined7)uStack_18);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->crcBuffer,(uchar *)((long)&uStack_18 + 7));
        uStack_18._0_7_ = CONCAT16((char)iVar3,(undefined6)uStack_18);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->inpBuffer,(uchar *)((long)&uStack_18 + 6));
        this->cByte = iVar3;
        this->remBits = 8;
        this->bCount = this->bCount + 1;
        this->flag = false;
      }
      else {
        this_00 = (CRC *)(this->crcBuffer).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        bVar2 = CRC::Calculate<unsigned_char,(unsigned_short)8>
                          (this_00,(this->crcBuffer).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -(long)this_00,
                           0x15f33b,(Parameters<unsigned_char,_(unsigned_short)8> *)(ulong)uVar4);
        this->cByte = (uint)bVar2;
        puVar1 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1;
        }
        this->remBits = 8;
        this->flag = true;
      }
    }
    uVar4 = this->remBits - 1;
    this->remBits = uVar4;
    return (ulong)((uint)this->cByte >> (uVar4 & 0x1f) & 1);
  }
  iVar3 = endStream(this);
  return CONCAT44(extraout_var,iVar3);
}

Assistant:

int BitInStream::read() {
    if (cByte == -1 || streamDone) {
        return endStream();
    }
    if (!remBits) {
        if (sync != 0 && (bCount % sync == 0) && !flag) {
            unsigned char temp = CRC::Calculate(crcBuffer.data(), crcBuffer.size() * sizeof(char), CRC::CRC_8_LTE());
            cByte = temp;
            crcBuffer.clear();
            remBits = 8;
            flag = true;
        } else {
            int temp = in.get();
            if (temp == -1) {
                return endStream();
            } else {
                crcBuffer.push_back(static_cast<unsigned char>(temp));
                inpBuffer.push_back(static_cast<unsigned char>(temp));
            }
            cByte = temp;
            remBits = 8;
            bCount++;
            flag = false;
        }
    }
    //assert remBits > 0
    remBits--;
    return (cByte >> remBits) & 1;
}